

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

void SUNDlsMat_DenseMatvec(SUNDlsMat A,realtype *x,realtype *y)

{
  SUNDlsMat_denseMatvec(A->cols,x,y,A->M,A->N);
  return;
}

Assistant:

void SUNDlsMat_DenseMatvec(SUNDlsMat A, realtype *x, realtype *y)
{
  SUNDlsMat_denseMatvec(A->cols, x, y, A->M, A->N);
}